

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators_test.cpp
# Opt level: O1

vector<std::pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* GetSamplers_abi_cxx11_
            (vector<std::pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,Point2i *resolution)

{
  int iVar1;
  HaltonSampler *this;
  Allocator AVar2;
  undefined8 *puVar3;
  ZSobolSampler *this_00;
  undefined4 *puVar4;
  PMJ02BNSampler *this_01;
  uint uVar5;
  int iVar6;
  allocator<char> local_51;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (HaltonSampler *)operator_new(0x38);
  AVar2.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::HaltonSampler::HaltonSampler(this,0x100,resolution,PermuteDigits,0,AVar2);
  local_50 = (undefined1  [8])((ulong)this | 0x3000000000000);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Halton 256",&local_51);
  std::
  vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
  ::emplace_back<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>
            ((vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
              *)__return_storage_ptr__,
             (pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  puVar3 = (undefined8 *)operator_new(0x18);
  *puVar3 = 0x200000100;
  puVar3[1] = 0;
  local_50 = (undefined1  [8])((ulong)puVar3 | 0x4000000000000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Padded Sobol 256",&local_51);
  std::
  vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
  ::emplace_back<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>
            ((vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
              *)__return_storage_ptr__,
             (pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  this_00 = (ZSobolSampler *)operator_new(0x20);
  pbrt::ZSobolSampler::ZSobolSampler(this_00,0x100,(Point2i)0x1000000010,PermuteDigits,0);
  local_50 = (undefined1  [8])((ulong)this_00 | 0x6000000000000);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Z Sobol 256",&local_51);
  std::
  vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
  ::emplace_back<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>
            ((vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
              *)__return_storage_ptr__,
             (pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 0x100;
  puVar4[2] = 0;
  *(undefined8 *)(puVar4 + 3) = 0;
  iVar1 = (resolution->super_Tuple2<pbrt::Point2,_int>).x;
  iVar6 = (resolution->super_Tuple2<pbrt::Point2,_int>).y;
  if (iVar6 < iVar1) {
    iVar6 = iVar1;
  }
  uVar5 = (int)(iVar6 - 1U) >> 1 | iVar6 - 1U;
  uVar5 = (int)uVar5 >> 2 | uVar5;
  uVar5 = (int)uVar5 >> 4 | uVar5;
  uVar5 = (int)uVar5 >> 8 | uVar5;
  puVar4[1] = ((int)uVar5 >> 0x10 | uVar5) + 1;
  local_50 = (undefined1  [8])((ulong)puVar4 | 0x5000000000000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Sobol 256 Not Randomized",&local_51);
  std::
  vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
  ::emplace_back<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>
            ((vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
              *)__return_storage_ptr__,
             (pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 0x100;
  puVar4[2] = 2;
  *(undefined8 *)(puVar4 + 3) = 0;
  iVar1 = (resolution->super_Tuple2<pbrt::Point2,_int>).x;
  iVar6 = (resolution->super_Tuple2<pbrt::Point2,_int>).y;
  if (iVar6 < iVar1) {
    iVar6 = iVar1;
  }
  uVar5 = (int)(iVar6 - 1U) >> 1 | iVar6 - 1U;
  uVar5 = (int)uVar5 >> 2 | uVar5;
  uVar5 = (int)uVar5 >> 4 | uVar5;
  uVar5 = (int)uVar5 >> 8 | uVar5;
  puVar4[1] = ((int)uVar5 >> 0x10 | uVar5) + 1;
  local_50 = (undefined1  [8])((ulong)puVar4 | 0x5000000000000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Sobol 256 XOR Scramble",&local_51);
  std::
  vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
  ::emplace_back<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>
            ((vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
              *)__return_storage_ptr__,
             (pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 0x100;
  puVar4[2] = 4;
  *(undefined8 *)(puVar4 + 3) = 0;
  iVar1 = (resolution->super_Tuple2<pbrt::Point2,_int>).x;
  iVar6 = (resolution->super_Tuple2<pbrt::Point2,_int>).y;
  if (iVar6 < iVar1) {
    iVar6 = iVar1;
  }
  uVar5 = (int)(iVar6 - 1U) >> 1 | iVar6 - 1U;
  uVar5 = (int)uVar5 >> 2 | uVar5;
  uVar5 = (int)uVar5 >> 4 | uVar5;
  uVar5 = (int)uVar5 >> 8 | uVar5;
  puVar4[1] = ((int)uVar5 >> 0x10 | uVar5) + 1;
  local_50 = (undefined1  [8])((ulong)puVar4 | 0x5000000000000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Sobol 256 Owen Scramble",&local_51);
  std::
  vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
  ::emplace_back<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>
            ((vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
              *)__return_storage_ptr__,
             (pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  puVar3 = (undefined8 *)operator_new(0x18);
  *puVar3 = 0x100;
  puVar3[1] = 0x853c49e6748fea9b;
  puVar3[2] = 0xda3e39cb94b95bdb;
  local_50 = (undefined1  [8])((ulong)puVar3 | 0x1000000000000);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Random 256",&local_51);
  std::
  vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
  ::emplace_back<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>
            ((vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
              *)__return_storage_ptr__,
             (pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  puVar3 = (undefined8 *)operator_new(0x30);
  *puVar3 = 0x1000000010;
  *(undefined4 *)(puVar3 + 1) = 0;
  *(undefined1 *)((long)puVar3 + 0xc) = 1;
  puVar3[2] = 0x853c49e6748fea9b;
  puVar3[3] = 0xda3e39cb94b95bdb;
  puVar3[4] = 0;
  puVar3[5] = 0;
  local_50 = (undefined1  [8])((ulong)puVar3 | 0x2000000000000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Stratified 16x16",&local_51);
  std::
  vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
  ::emplace_back<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>
            ((vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
              *)__return_storage_ptr__,
             (pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  this_01 = (PMJ02BNSampler *)operator_new(0x28);
  AVar2.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::PMJ02BNSampler::PMJ02BNSampler(this_01,0x100,0,AVar2);
  local_50 = (undefined1  [8])((ulong)this_01 | 0x7000000000000);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"PMJ02bn 256",&local_51);
  std::
  vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
  ::emplace_back<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>
            ((vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
              *)__return_storage_ptr__,
             (pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<SamplerHandle, std::string>> GetSamplers(
    const Point2i &resolution) {
    std::vector<std::pair<SamplerHandle, std::string>> samplers;

    samplers.push_back(std::make_pair(new HaltonSampler(256, resolution), "Halton 256"));
    samplers.push_back(std::make_pair(new PaddedSobolSampler(256, RandomizeStrategy::PermuteDigits),
                                      "Padded Sobol 256"));
    samplers.push_back(std::make_pair(new ZSobolSampler(256, Point2i(16, 16), RandomizeStrategy::PermuteDigits),
                                      "Z Sobol 256"));
    samplers.push_back(
        std::make_pair(new SobolSampler(256, resolution, RandomizeStrategy::None),
                       "Sobol 256 Not Randomized"));
    samplers.push_back(
        std::make_pair(new SobolSampler(256, resolution, RandomizeStrategy::PermuteDigits),
                       "Sobol 256 XOR Scramble"));
    samplers.push_back(
        std::make_pair(new SobolSampler(256, resolution, RandomizeStrategy::Owen),
                       "Sobol 256 Owen Scramble"));
    samplers.push_back(std::make_pair(new RandomSampler(256), "Random 256"));
    samplers.push_back(
        std::make_pair(new StratifiedSampler(16, 16, true), "Stratified 16x16"));
    samplers.push_back(std::make_pair(new PMJ02BNSampler(256), "PMJ02bn 256"));

    return samplers;
}